

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifwrd(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  runcxdef *ctx_00;
  vocoldef *lst;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint16_t tmp;
  uint uVar5;
  uint16_t tmp_1;
  undefined1 *puVar6;
  char *__s;
  runsdef val;
  uchar buf [128];
  runsdef local_c8;
  short local_b8;
  undefined1 local_b6 [134];
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  ctx_00 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x01') {
    ctx_00->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3eb);
  }
  iVar2 = *(int *)&ctx_00->runcxsp->runsv;
  if (iVar2 == 1) {
    lVar3 = 0x1110;
  }
  else {
    if (iVar2 != 2) {
      runpnil(ctx_00);
      return;
    }
    lVar3 = 0x1118;
  }
  lst = *(vocoldef **)((long)ctx_00->runcxvoc->voccxinh + lVar3 + -0x58);
  if (lst != (vocoldef *)0x0) {
    iVar2 = voclistlen(lst);
    if (((iVar2 != 0) && (__s = lst->vocolfst, __s != (char *)0x0)) &&
       (lst->vocollst != (char *)0x0)) {
      puVar6 = local_b6;
      for (; __s <= lst->vocollst; __s = __s + ((int)sVar4 + 1)) {
        *puVar6 = 3;
        sVar4 = strlen(__s);
        uVar5 = (int)sVar4 + 2;
        *(short *)(puVar6 + 1) = (short)uVar5;
        strcpy(puVar6 + 3,__s);
        puVar6 = puVar6 + (ulong)uVar5 + 1;
      }
      goto LAB_00125ed1;
    }
  }
  puVar6 = local_b6;
LAB_00125ed1:
  local_c8.runsv.runsvstr = (uchar *)&local_b8;
  local_b8 = (short)puVar6 - local_c8.runsv.runsvobj;
  local_c8.runstyp = '\a';
  runpush(ctx->bifcxrun,7,&local_c8);
  return;
}

Assistant:

void bifwrd(bifcxdef *ctx, int argc)
{
    int       ob;
    vocoldef *v;
    uchar     buf[128];
    uchar    *dst;
    uchar    *src;
    uint      len;
    runsdef   val;
    
    bifcntargs(ctx, 1, argc);

    /* figure out what word list to get */
    ob = runpopnum(ctx->bifcxrun);
    switch(ob)
    {
    case 1:
        v = ctx->bifcxrun->runcxvoc->voccxdobj;
        break;

    case 2:
        v = ctx->bifcxrun->runcxvoc->voccxiobj;
        break;

    default:
        runpnil(ctx->bifcxrun);
        return;
    }

    /* now build a list of strings from the words, if there are any */
    if (v != 0 && voclistlen(v) != 0 && v->vocolfst != 0 && v->vocollst != 0)
    {
        for (dst = buf + 2, src = (uchar *)v->vocolfst ;
             src <= (uchar *)v->vocollst ; src += len + 1)
        {
            *dst++ = DAT_SSTRING;
            len = strlen((char *)src);
            oswp2(dst, len + 2);
            strcpy((char *)dst + 2, (char *)src);
            dst += len + 2;
        }
    }
    else
        dst = buf + 2;

    /* finish setting up the list length and return it */
    len = dst - buf;
    oswp2(buf, len);
    val.runsv.runsvstr = buf;
    val.runstyp = DAT_LIST;
    runpush(ctx->bifcxrun, DAT_LIST, &val);
}